

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ConstCastTestT<short>(void)

{
  int iVar1;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffff40;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_32;
  short local_30;
  short local_2e;
  short local_2c;
  short local_2a;
  short local_28;
  short local_26;
  short local_24;
  short local_22;
  short local_20;
  short local_1e;
  short local_1c;
  short local_1a;
  short local_18;
  short local_16;
  short local_2;
  
  if (ConstCastTestT<short>()::b == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::b);
    if (iVar1 != 0) {
      local_2 = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::b = ::SafeInt::operator_cast_to_bool((SafeInt *)&local_2);
      __cxa_guard_release(&ConstCastTestT<short>()::b);
    }
  }
  if (ConstCastTestT<short>()::w == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::w);
    if (iVar1 != 0) {
      local_16 = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::w = ::SafeInt::operator_cast_to_wchar_t(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<short>()::w);
    }
  }
  if (ConstCastTestT<short>()::c == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::c);
    if (iVar1 != 0) {
      local_18 = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::c = ::SafeInt::operator_cast_to_char(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<short>()::c);
    }
  }
  if (ConstCastTestT<short>()::sc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::sc);
    if (iVar1 != 0) {
      local_1a = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::sc = ::SafeInt::operator_cast_to_signed_char(in_stack_ffffffffffffff40)
      ;
      __cxa_guard_release(&ConstCastTestT<short>()::sc);
    }
  }
  if (ConstCastTestT<short>()::uc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::uc);
    if (iVar1 != 0) {
      local_1c = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::uc =
           ::SafeInt::operator_cast_to_unsigned_char(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<short>()::uc);
    }
  }
  if (ConstCastTestT<short>()::s == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::s);
    if (iVar1 != 0) {
      local_1e = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::s = ::SafeInt::operator_cast_to_short(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<short>()::s);
    }
  }
  if (ConstCastTestT<short>()::us == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::us);
    if (iVar1 != 0) {
      local_20 = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::us =
           ::SafeInt::operator_cast_to_unsigned_short(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<short>()::us);
    }
  }
  if (ConstCastTestT<short>()::i == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::i);
    if (iVar1 != 0) {
      local_22 = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::i = ::SafeInt::operator_cast_to_int(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<short>()::i);
    }
  }
  if (ConstCastTestT<short>()::ui == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::ui);
    if (iVar1 != 0) {
      local_24 = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::ui =
           ::SafeInt::operator_cast_to_unsigned_int(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<short>()::ui);
    }
  }
  if (ConstCastTestT<short>()::l == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::l);
    if (iVar1 != 0) {
      local_26 = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::l = ::SafeInt::operator_cast_to_long(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<short>()::l);
    }
  }
  if (ConstCastTestT<short>()::ul == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::ul);
    if (iVar1 != 0) {
      local_28 = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::ul =
           ::SafeInt::operator_cast_to_unsigned_long(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<short>()::ul);
    }
  }
  if (ConstCastTestT<short>()::ll == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::ll);
    if (iVar1 != 0) {
      local_2a = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::ll = ::SafeInt::operator_cast_to_long_long(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<short>()::ll);
    }
  }
  if (ConstCastTestT<short>()::ull == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::ull);
    if (iVar1 != 0) {
      local_2c = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::ull =
           ::SafeInt::operator_cast_to_unsigned_long_long(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<short>()::ull);
    }
  }
  if (ConstCastTestT<short>()::st == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::st);
    if (iVar1 != 0) {
      local_2e = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::st =
           ::SafeInt::operator_cast_to_unsigned_long(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<short>()::st);
    }
  }
  if (ConstCastTestT<short>()::pt == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::pt);
    if (iVar1 != 0) {
      local_30 = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::pt = ::SafeInt::operator_cast_to_long(in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff40 =
           (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
           )ConstCastTestT<short>::pt;
      __cxa_guard_release(&ConstCastTestT<short>()::pt);
    }
  }
  if (ConstCastTestT<short>()::pl == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<short>()::pl);
    if (iVar1 != 0) {
      local_32 = ConstSafeInt<short>();
      SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      operator+(&local_32);
      ConstCastTestT<short>::pl = ::SafeInt::operator_cast_to_int(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<short>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}